

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O2

string * __thiscall
GeneratorExpressionContent::EvaluateParameters
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  pointer ppcVar1;
  pointer ppcVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  pointer ppcVar6;
  ostream *poVar7;
  const_iterator pit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  uint local_1c8;
  uint local_1c4;
  cmGeneratorExpressionNode *local_1c0;
  pointer local_1b8;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *local_1b0;
  string parameter;
  
  uVar3 = (*node->_vptr_cmGeneratorExpressionNode[5])(node);
  pit._M_current =
       (this->ParamChildren).
       super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b8 = (this->ParamChildren).
              super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = node;
  iVar4 = (*node->_vptr_cmGeneratorExpressionNode[4])(node);
  local_1f0 = &__return_storage_ptr__->field_2;
  uVar5 = 1;
  local_1c8 = uVar3;
  while (uVar3 = local_1c8, pit._M_current != local_1b8) {
    local_1c4 = uVar5;
    if ((uVar5 == local_1c8 & (byte)iVar4) == 1) {
      ProcessArbitraryContent(&parameter,this,local_1c0,identifier,context,dagChecker,pit);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(parameters,&parameter);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f0;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::~string((string *)&parameter);
      return __return_storage_ptr__;
    }
    parameter._M_dataplus._M_p = (pointer)&parameter.field_2;
    parameter._M_string_length = 0;
    parameter.field_2._M_local_buf[0] = '\0';
    ppcVar1 = ((pit._M_current)->
              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    ppcVar2 = ((pit._M_current)->
              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_1b0 = pit._M_current;
    do {
      ppcVar6 = ppcVar2;
      if (ppcVar6 == ppcVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(parameters,&parameter);
        goto LAB_003a377c;
      }
      (*(*ppcVar6)->_vptr_cmGeneratorExpressionEvaluator[3])(&local_210,*ppcVar6,context,dagChecker)
      ;
      std::__cxx11::string::append((string *)&parameter);
      std::__cxx11::string::~string((string *)&local_210);
      ppcVar2 = ppcVar6 + 1;
    } while (context->HadError != true);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f0;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_003a377c:
    std::__cxx11::string::~string((string *)&parameter);
    if (ppcVar6 != ppcVar1) {
      return __return_storage_ptr__;
    }
    uVar5 = local_1c4 + 1;
    pit._M_current = local_1b0 + 1;
  }
  if (((int)local_1c8 < 1) ||
     ((long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)local_1c8)) {
    if (local_1c8 == 0xfffffffe) {
      if ((ulong)((long)(parameters->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(parameters->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_003a3a88;
      GetOriginalExpression_abi_cxx11_(&parameter,this);
      std::operator+(&local_1e8,"$<",identifier);
      std::operator+(&local_210,&local_1e8,"> expression requires one or zero parameters.");
      reportError(context,&parameter,&local_210);
    }
    else {
      if ((local_1c8 != 0xffffffff) ||
         ((parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish)) goto LAB_003a3a88;
      GetOriginalExpression_abi_cxx11_(&parameter,this);
      std::operator+(&local_1e8,"$<",identifier);
      std::operator+(&local_210,&local_1e8,"> expression requires at least one parameter.");
      reportError(context,&parameter,&local_210);
    }
  }
  else {
    if (local_1c8 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&parameter);
      std::operator+(&local_1e8,"$<",identifier);
      std::operator+(&local_210,&local_1e8,"> expression requires ");
      poVar7 = std::operator<<((ostream *)&parameter,(string *)&local_210);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar3);
      poVar7 = std::operator<<(poVar7," comma separated parameters, but got ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7," instead.");
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1e8);
      GetOriginalExpression_abi_cxx11_(&local_210,this);
      std::__cxx11::stringbuf::str();
      reportError(context,&local_210,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&parameter);
      goto LAB_003a3a88;
    }
    GetOriginalExpression_abi_cxx11_(&parameter,this);
    std::operator+(&local_1e8,"$<",identifier);
    std::operator+(&local_210,&local_1e8,"> expression requires exactly one parameter.");
    reportError(context,&parameter,&local_210);
  }
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&parameter);
LAB_003a3a88:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorExpressionContent::EvaluateParameters(
                                const cmGeneratorExpressionNode *node,
                                const std::string &identifier,
                                cmGeneratorExpressionContext *context,
                                cmGeneratorExpressionDAGChecker *dagChecker,
                                std::vector<std::string> &parameters) const
{
  const int numExpected = node->NumExpectedParameters();
  {
  std::vector<std::vector<cmGeneratorExpressionEvaluator*> >::const_iterator
                                        pit = this->ParamChildren.begin();
  const
  std::vector<std::vector<cmGeneratorExpressionEvaluator*> >::const_iterator
                                        pend = this->ParamChildren.end();
  const bool acceptsArbitraryContent
                                  = node->AcceptsArbitraryContentParameter();
  int counter = 1;
  for ( ; pit != pend; ++pit, ++counter)
    {
    if (acceptsArbitraryContent && counter == numExpected)
      {
      std::string lastParam = this->ProcessArbitraryContent(node, identifier,
                                                            context,
                                                            dagChecker,
                                                            pit);
      parameters.push_back(lastParam);
      return std::string();
      }
    else
      {
      std::string parameter;
      std::vector<cmGeneratorExpressionEvaluator*>::const_iterator it =
                                                                pit->begin();
      const std::vector<cmGeneratorExpressionEvaluator*>::const_iterator end =
                                                                pit->end();
      for ( ; it != end; ++it)
        {
        parameter += (*it)->Evaluate(context, dagChecker);
        if (context->HadError)
          {
          return std::string();
          }
        }
      parameters.push_back(parameter);
      }
    }
  }

  if ((numExpected > cmGeneratorExpressionNode::DynamicParameters
      && (unsigned int)numExpected != parameters.size()))
    {
    if (numExpected == 0)
      {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires no parameters.");
      }
    else if (numExpected == 1)
      {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires "
                  "exactly one parameter.");
      }
    else
      {
      std::ostringstream e;
      e << "$<" + identifier + "> expression requires "
        << numExpected
        << " comma separated parameters, but got "
        << parameters.size() << " instead.";
      reportError(context, this->GetOriginalExpression(), e.str());
      }
    return std::string();
    }

  if (numExpected == cmGeneratorExpressionNode::OneOrMoreParameters
      && parameters.empty())
    {
    reportError(context, this->GetOriginalExpression(), "$<" + identifier
                      + "> expression requires at least one parameter.");
    }
  if (numExpected == cmGeneratorExpressionNode::OneOrZeroParameters
      && parameters.size() > 1)
    {
    reportError(context, this->GetOriginalExpression(), "$<" + identifier
                      + "> expression requires one or zero parameters.");
    }
  return std::string();
}